

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void __thiscall
toml::basic_value<toml::type_config>::cleanup
          (basic_value<toml::type_config> *this,EVP_PKEY_CTX *ctx)

{
  switch(this->type_) {
  case boolean:
    break;
  case integer:
    toml::detail::value_with_format<long,_toml::integer_format_info>::~value_with_format
              ((value_with_format<long,_toml::integer_format_info> *)0x25b6a6);
    break;
  case floating:
    toml::detail::value_with_format<double,_toml::floating_format_info>::~value_with_format
              ((value_with_format<double,_toml::floating_format_info> *)0x25b6b5);
    break;
  case string:
    toml::detail::
    value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
    ::~value_with_format
              ((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                *)0x25b6c4);
    break;
  case offset_datetime:
    break;
  case local_datetime:
    break;
  case local_date:
    break;
  case local_time:
    break;
  case array:
    toml::detail::
    value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
    ::~value_with_format
              ((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                *)0x25b6db);
    break;
  case table:
    toml::detail::
    value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
    ::~value_with_format
              ((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                *)0x25b6ea);
  }
  this->type_ = empty;
  return;
}

Assistant:

void cleanup() noexcept
    {
        switch(this->type_)
        {
            case value_t::boolean         : { boolean_        .~boolean_storage         (); break; }
            case value_t::integer         : { integer_        .~integer_storage         (); break; }
            case value_t::floating        : { floating_       .~floating_storage        (); break; }
            case value_t::string          : { string_         .~string_storage          (); break; }
            case value_t::offset_datetime : { offset_datetime_.~offset_datetime_storage (); break; }
            case value_t::local_datetime  : { local_datetime_ .~local_datetime_storage  (); break; }
            case value_t::local_date      : { local_date_     .~local_date_storage      (); break; }
            case value_t::local_time      : { local_time_     .~local_time_storage      (); break; }
            case value_t::array           : { array_          .~array_storage           (); break; }
            case value_t::table           : { table_          .~table_storage           (); break; }
            default                       : { break; }
        }
        this->type_ = value_t::empty;
        return;
    }